

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute __thiscall pugi::xml_node::prepend_copy(xml_node *this,xml_attribute *proto)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *da;
  uint uVar5;
  xml_memory_page *local_20;
  
  if ((proto->_attr != (xml_attribute_struct *)0x0) &&
     (pxVar2 = this->_root, pxVar2 != (xml_node_struct *)0x0)) {
    uVar5 = (uint)pxVar2->header & 0xf;
    if ((uVar5 == 7) || (uVar5 == 2)) {
      this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
      uVar1 = this_00->_busy_size + 0x28;
      if (uVar1 < 0x7fd9) {
        local_20 = this_00->_root;
        da = (xml_attribute_struct *)((long)&local_20[1].allocator + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        da = (xml_attribute_struct *)
             impl::anon_unknown_0::xml_allocator::allocate_memory_oob(this_00,0x28,&local_20);
        if (da == (xml_attribute_struct *)0x0) {
          return (xml_attribute)(xml_attribute_struct *)0x0;
        }
      }
      da->prev_attribute_c = (xml_attribute_struct *)0x0;
      da->next_attribute = (xml_attribute_struct *)0x0;
      da->name = (char_t *)0x0;
      da->value = (char_t *)0x0;
      da->header = ((long)da - (long)local_20) * 0x100;
      pxVar2 = this->_root;
      pxVar3 = pxVar2->first_attribute;
      pxVar4 = da;
      if (pxVar3 != (xml_attribute_struct *)0x0) {
        da->prev_attribute_c = pxVar3->prev_attribute_c;
        pxVar4 = pxVar3;
      }
      pxVar4->prev_attribute_c = da;
      da->next_attribute = pxVar3;
      pxVar2->first_attribute = da;
      impl::anon_unknown_0::node_copy_attribute(da,proto->_attr);
      return (xml_attribute)da;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}